

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void vec_add_internal(void *v,void *elem)

{
  uint uVar1;
  uint uVar2;
  void *__dest;
  byte bVar3;
  ulong uVar4;
  
  uVar1 = *v;
  uVar4 = (ulong)uVar1;
  if (uVar4 == 0) {
    __dest = (void *)((long)v + 0x10);
    *(void **)((long)v + 8) = __dest;
    uVar4 = 0;
  }
  else {
    __dest = *(void **)((long)v + 8);
    if (__dest == (void *)((long)v + 0x10)) {
      __dest = malloc(0x40);
      *(void **)((long)v + 8) = __dest;
      memcpy(__dest,(void *)((long)v + 0x10),uVar4 << 3);
    }
    else if ((uVar1 & 7) == 0) {
      bVar3 = 4;
      uVar2 = uVar1 & 8;
      uVar1 = (int)uVar1 >> 3;
      while (uVar2 == 0) {
        bVar3 = bVar3 + 1;
        uVar2 = uVar1 & 2;
        uVar1 = (int)uVar1 >> 1;
      }
      if (uVar1 < 2) {
        __dest = realloc(__dest,(long)(1 << (bVar3 & 0x1f)) << 3);
        *(void **)((long)v + 8) = __dest;
        uVar4 = (ulong)*v;
      }
    }
  }
  *(void **)((long)__dest + uVar4 * 8) = elem;
  *(int *)v = (int)uVar4 + 1;
  return;
}

Assistant:

void vec_add_internal(void *v, void *elem) {
  AbstractVec *av = (AbstractVec *)v;
  if (!av->n) {
    av->v = av->e;
  } else if (av->v == av->e) {
    av->v = (void **)MALLOC(INITIAL_VEC_SIZE * sizeof(void *));
    memcpy(av->v, av->e, av->n * sizeof(void *));
  } else {
    if ((av->n & (INITIAL_VEC_SIZE - 1)) == 0) {
      int l = av->n, nl = (1 + INITIAL_VEC_SHIFT);
      l = l >> INITIAL_VEC_SHIFT;
      while (!(l & 1)) {
        l = l >> 1;
        nl++;
      }
      l = l >> 1;
      if (!av->n || !l) {
        nl = 1 << nl;
        av->v = (void **)REALLOC(av->v, nl * sizeof(void *));
      }
    }
  }
  av->v[av->n] = elem;
  av->n++;
}